

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kpr_mri.c
# Opt level: O1

int Jn(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2,
      N_Vector tmp3)

{
  double dVar1;
  double *pdVar2;
  sunrealtype *rpar;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x10);
  pdVar2 = *(double **)((long)y->content + 0x10);
  dVar5 = *pdVar2;
  dVar7 = pdVar2[1];
  dVar3 = cos(t);
  dVar4 = sin(t);
  dVar5 = (dVar5 + dVar5) * dVar5;
  *(double *)**(undefined8 **)((long)J->content + 0x20) =
       ((dVar3 * 0.5 + 1.0) * dVar6 + dVar4 * 0.5) / dVar5 + dVar6 * 0.5;
  dVar6 = cos(*(double *)((long)user_data + 8) * t);
  dVar7 = (dVar7 + dVar7) * dVar7;
  **(double **)(*(long *)((long)J->content + 0x20) + 8) =
       ((dVar6 + 2.0) * dVar1) / dVar7 + dVar1 * 0.5;
  dVar6 = cos(t);
  *(double *)(**(long **)((long)J->content + 0x20) + 8) =
       ((dVar6 * 0.5 + 1.0) * dVar1) / dVar5 + dVar1 * 0.5;
  dVar6 = cos(t * *(double *)((long)user_data + 8));
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 8) + 8) = -0.5 - (dVar6 + 2.0) / dVar7;
  return 0;
}

Assistant:

static int Jn(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
              void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype* rpar   = (sunrealtype*)user_data;
  const sunrealtype G = rpar[0];
  const sunrealtype e = rpar[2];
  const sunrealtype u = NV_Ith_S(y, 0);
  const sunrealtype v = NV_Ith_S(y, 1);

  /* fill in the Jacobian:
     [G/2 + (G*(1+r(t))-rdot(t))/(2*u^2)     e/2 + e*(2+s(t))/(2*v^2)]
     [e/2+e*(1+r(t))/(2*u^2)                -1/2 - (2+s(t))/(2*v^2)  ] */
  SM_ELEMENT_D(J, 0, 0) = G / TWO + (G * (ONE + r(t, rpar)) - rdot(t, rpar)) /
                                      (2 * u * u);
  SM_ELEMENT_D(J, 0, 1) = e / TWO + e * (TWO + s(t, rpar)) / (TWO * v * v);
  SM_ELEMENT_D(J, 1, 0) = e / TWO + e * (ONE + r(t, rpar)) / (TWO * u * u);
  SM_ELEMENT_D(J, 1, 1) = -ONE / TWO - (TWO + s(t, rpar)) / (TWO * v * v);

  /* Return with success */
  return 0;
}